

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O0

void __thiscall cmParseMumpsCoverage::InitializeMumpsFile(cmParseMumpsCoverage *this,string *file)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong local_270;
  size_type i;
  value_type_conflict2 local_260;
  value_type_conflict2 vStack_25c;
  bool found;
  int val;
  SingleFileCoverageVector *coverageVector;
  string line;
  long local_220;
  ifstream in;
  string *file_local;
  cmParseMumpsCoverage *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&coverageVector);
    _val = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&this->Coverage->TotalCoverage,file);
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&local_220,(string *)&coverageVector,(bool *)0x0,-1);
    if (bVar2) {
      vStack_25c = -1;
      std::vector<int,_std::allocator<int>_>::push_back(_val,&stack0xfffffffffffffda4);
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_220,(string *)&coverageVector,(bool *)0x0,-1),
            bVar2) {
        local_260 = -1;
        bVar2 = false;
        for (local_270 = 0; uVar4 = std::__cxx11::string::size(), local_270 < uVar4;
            local_270 = local_270 + 1) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector);
          if (((*pcVar3 == ' ') ||
              (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector),
              *pcVar3 == '\t')) ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector),
             *pcVar3 == ';')) {
            bVar2 = true;
            break;
          }
        }
        if (bVar2) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector);
          if ((*pcVar3 == ' ') ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector),
             *pcVar3 == '\t')) {
            while( true ) {
              uVar4 = std::__cxx11::string::size();
              bVar2 = false;
              if (local_270 < uVar4) {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector);
                bVar2 = true;
                if (*pcVar3 != ' ') {
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector);
                  bVar2 = true;
                  if (*pcVar3 != '\t') {
                    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector);
                    bVar2 = *pcVar3 == '.';
                  }
                }
              }
              if (!bVar2) break;
              local_270 = local_270 + 1;
            }
          }
          uVar4 = std::__cxx11::string::size();
          if ((local_270 < uVar4) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&coverageVector),
             *pcVar3 != ';')) {
            local_260 = 0;
          }
        }
        std::vector<int,_std::allocator<int>_>::push_back(_val,&local_260);
      }
      line.field_2._8_4_ = 0;
    }
    else {
      line.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&coverageVector);
  }
  else {
    line.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void cmParseMumpsCoverage::InitializeMumpsFile(std::string& file)
{
  // initialize the coverage information for a given mumps file
  cmsys::ifstream in(file.c_str());
  if (!in) {
    return;
  }
  std::string line;
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
    this->Coverage.TotalCoverage[file];
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    return;
  }
  // first line of a .m file can never be run
  coverageVector.push_back(-1);
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // putting in a 0 for a line means it is executable code
    // putting in a -1 for a line means it is not executable code
    int val = -1; // assume line is not executable
    bool found = false;
    std::string::size_type i = 0;
    // (1) Search for the first whitespace or semicolon character on a line.
    // This will skip over labels if the line starts with one, or will simply
    // be the first character on the line for non-label lines.
    for (; i < line.size(); ++i) {
      if (line[i] == ' ' || line[i] == '\t' || line[i] == ';') {
        found = true;
        break;
      }
    }
    if (found) {
      // (2) If the first character found above is whitespace or a period
      // then continue the search for the first following non-whitespace
      // character.
      if (line[i] == ' ' || line[i] == '\t') {
        while (i < line.size() &&
               (line[i] == ' ' || line[i] == '\t' || line[i] == '.')) {
          i++;
        }
      }
      // (3) If the character found is not a semicolon then the line counts for
      // coverage.
      if (i < line.size() && line[i] != ';') {
        val = 0;
      }
    }
    coverageVector.push_back(val);
  }
}